

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32 png_get_gAMA(png_const_structrp png_ptr,png_const_inforp info_ptr,double *file_gamma)

{
  double *file_gamma_local;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
      (((info_ptr->colorspace).flags & 1) == 0)) || (file_gamma == (double *)0x0)) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    *file_gamma = (double)(info_ptr->colorspace).gamma * 1e-05;
    png_ptr_local._4_4_ = 1;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_gAMA(png_const_structrp png_ptr, png_const_inforp info_ptr,
    double *file_gamma)
{
   png_debug1(1, "in %s retrieval function", "gAMA(float)");

   if (png_ptr != NULL && info_ptr != NULL &&
      (info_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_GAMMA) != 0 &&
      file_gamma != NULL)
   {
      *file_gamma = png_float(png_ptr, info_ptr->colorspace.gamma,
          "png_get_gAMA");
      return (PNG_INFO_gAMA);
   }

   return (0);
}